

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O0

ostream * pstack::operator<<(ostream *os,JSON<pstack::ProgramHeaderName,_char> *ph)

{
  initializer_list<std::pair<const_int,_const_char_*>_> __l;
  JSON<pstack::ProgramHeaderName,_char> *os_00;
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  ostream *poVar4;
  char local_119;
  JSON<const_char_*,_char> local_118;
  _Self local_108;
  _Self local_100;
  const_iterator namei;
  allocator<std::pair<const_int,_const_char_*>_> local_e2;
  less<int> local_e1;
  pair<const_int,_const_char_*> local_e0 [11];
  iterator local_30;
  size_type local_28;
  JSON<pstack::ProgramHeaderName,_char> *local_20;
  JSON<pstack::ProgramHeaderName,_char> *ph_local;
  ostream *os_local;
  
  local_20 = ph;
  ph_local = (JSON<pstack::ProgramHeaderName,_char> *)os;
  if (operator<<(std::ostream&,pstack::JSON<pstack::ProgramHeaderName,char>const&)::names == '\0') {
    iVar2 = __cxa_guard_acquire(&operator<<(std::ostream&,pstack::JSON<pstack::ProgramHeaderName,char>const&)
                                 ::names);
    if (iVar2 != 0) {
      memcpy(local_e0,&DAT_002f2200,0xb0);
      local_28 = 0xb;
      local_30 = local_e0;
      std::allocator<std::pair<const_int,_const_char_*>_>::allocator(&local_e2);
      __l._M_len = local_28;
      __l._M_array = local_30;
      std::
      map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>::
      map(&operator<<::names,__l,&local_e1,&local_e2);
      std::allocator<std::pair<const_int,_const_char_*>_>::~allocator(&local_e2);
      __cxa_atexit(std::
                   map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
                   ::~map,&operator<<::names,&__dso_handle);
      __cxa_guard_release(&operator<<(std::ostream&,pstack::JSON<pstack::ProgramHeaderName,char>const&)
                           ::names);
    }
  }
  local_100._M_node =
       (_Base_ptr)
       std::
       map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
       ::find(&operator<<::names,&local_20->object->type);
  local_108._M_node =
       (_Base_ptr)
       std::
       map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
       ::end(&operator<<::names);
  bVar1 = std::operator==(&local_100,&local_108);
  os_00 = ph_local;
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    poVar4 = std::operator<<((ostream *)ph_local,'\"');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_20->object->type);
    os_local = std::operator<<(poVar4,'\"');
  }
  else {
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_int,_const_char_*>_>::operator->
                       (&local_100);
    local_119 = '\0';
    local_118 = json<char_const*,char>(&ppVar3->second,&local_119);
    os_local = operator<<((ostream *)os_00,&local_118);
  }
  return os_local;
}

Assistant:

std::ostream &operator << (std::ostream &os, const JSON<ProgramHeaderName> &ph)
{
    static const std::map<int, const char *> names = {
#define strpair(x) { x, #x }
        strpair(PT_NULL),
        strpair(PT_LOAD),
        strpair(PT_DYNAMIC),
        strpair(PT_INTERP),
        strpair(PT_NOTE),
        strpair(PT_SHLIB),
        strpair(PT_PHDR),
        strpair(PT_TLS),
        strpair(PT_GNU_EH_FRAME),
        strpair(PT_GNU_STACK),
        strpair(PT_GNU_RELRO)
#undef strpair
    };
    auto namei = names.find(ph.object.type);
    if (namei != names.end())
        return os << json(namei->second);
    return os << '"' << ph.object.type << '"';
}